

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_generic_section.cpp
# Opt level: O0

void __thiscall
GenericSectionImport_TextMissingAlign_Test::~GenericSectionImport_TextMissingAlign_Test
          (GenericSectionImport_TextMissingAlign_Test *this)

{
  GenericSectionImport_TextMissingAlign_Test *this_local;
  
  ~GenericSectionImport_TextMissingAlign_Test(this);
  operator_delete(this,0x150);
  return;
}

Assistant:

TEST_F (GenericSectionImport, TextMissingAlign) {
    std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher>> dispatchers;
    auto inserter = std::back_inserter (dispatchers);
    pstore::repo::section_content imported_content;

    // The align value is missing.
    auto const & parser = parse<pstore::repo::section_kind::text> (
        R"({ "data":"" })", &db_, pstore::exchange::import_ns::string_mapping{}, &inserter,
        &imported_content);
    ASSERT_FALSE (parser.has_error ()) << "JSON error was: " << parser.last_error ().message ();
    EXPECT_EQ (imported_content.align, 1U);
    EXPECT_TRUE (imported_content.data.empty ());
}